

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

Closure * luaF_newCclosure(lua_State *L,int nelems,Table *e)

{
  GCObject *o;
  Closure *c;
  Table *e_local;
  int nelems_local;
  lua_State *L_local;
  
  o = (GCObject *)luaM_realloc_(L,(void *)0x0,0,(long)((nelems + -1) * 0x10 + 0x38));
  luaC_link(L,o,'\x06');
  (o->h).flags = '\x01';
  (o->h).array = (TValue *)e;
  (o->h).lsizenode = (lu_byte)nelems;
  return (Closure *)o;
}

Assistant:

static Closure*luaF_newCclosure(lua_State*L,int nelems,Table*e){
Closure*c=cast(Closure*,luaM_malloc(L,sizeCclosure(nelems)));
luaC_link(L,obj2gco(c),6);
c->c.isC=1;
c->c.env=e;
c->c.nupvalues=cast_byte(nelems);
return c;
}